

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Copy_24_To_24(void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride
                  ,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  uchar *src;
  undefined1 *puVar1;
  uchar *dest;
  undefined1 *puVar2;
  bool bVar3;
  
  puVar1 = (undefined1 *)((long)sourceBuffer + 2);
  puVar2 = (undefined1 *)((long)destinationBuffer + 2);
  while (bVar3 = count != 0, count = count - 1, bVar3) {
    puVar2[-2] = puVar1[-2];
    puVar2[-1] = puVar1[-1];
    *puVar2 = *puVar1;
    puVar1 = puVar1 + sourceStride * 3;
    puVar2 = puVar2 + destinationStride * 3;
  }
  return;
}

Assistant:

static void Copy_24_To_24(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char*)sourceBuffer;
    unsigned char *dest = (unsigned char*)destinationBuffer;

    (void) ditherGenerator; /* unused parameter */

    while( count-- )
    {
        dest[0] = src[0];
        dest[1] = src[1];
        dest[2] = src[2];

        src += sourceStride * 3;
        dest += destinationStride * 3;
    }
}